

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

int __thiscall
glslang::TDefaultGlslIoResolver::resolveBinding
          (TDefaultGlslIoResolver *this,EShLanguage stage,TVarEntryInfo *ent)

{
  TSlotMap *this_00;
  char cVar1;
  int iVar2;
  int iVar3;
  TResourceType res;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  mapped_type *pmVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
  *this_01;
  iterator iVar8;
  mapped_type *pmVar9;
  TResourceType set;
  int resourceKey;
  EShLanguage local_40;
  int local_3c;
  key_type *local_38;
  long *plVar5;
  
  local_40 = stage;
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  iVar3 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
  iVar2 = 1;
  if (((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl != 0) &&
     (cVar1 = (**(code **)(*plVar5 + 0xf0))(plVar5), cVar1 != '\0')) {
    iVar2 = (**(code **)(*plVar5 + 0x88))(plVar5);
  }
  res = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x15])
                  (this,plVar5);
  if ((res == EResUbo) && (iVar4 = (**(code **)(*plVar5 + 0x38))(plVar5), iVar4 != 0x10)) {
LAB_003711cc:
    ent->newBinding = -1;
    return -1;
  }
  set = res;
  if ((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl == 0) {
    set = ent->newSet;
  }
  if (5 < (int)res) goto LAB_003711cc;
  resourceKey = set;
  local_38 = (key_type *)CONCAT44(extraout_var_00,iVar3);
  lVar6 = (**(code **)(*plVar5 + 0x58))(plVar5);
  if ((short)((ulong)*(undefined8 *)(lVar6 + 0x1c) >> 0x20) != -1) {
    iVar3 = TDefaultIoResolverBase::getBaseBinding
                      (&this->super_TDefaultIoResolverBase,local_40,res,set);
    lVar6 = (**(code **)(*plVar5 + 0x58))(plVar5);
    iVar3 = (uint)*(ushort *)(lVar6 + 0x20) + iVar3;
    TDefaultIoResolverBase::reserveSlot(&this->super_TDefaultIoResolverBase,set,iVar3,iVar2);
    ent->newBinding = iVar3;
    return iVar3;
  }
  ent->newBinding = -1;
  this_00 = &this->resourceSlotMap;
  local_3c = iVar2;
  pmVar7 = std::
           map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
           ::operator[](this_00,&resourceKey);
  if ((pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00371216:
    iVar2 = resourceKey;
    if ((ent->live != true) ||
       (((this->super_TDefaultIoResolverBase).referenceIntermediate)->autoMapBindings != true))
    goto LAB_00371273;
    iVar3 = TDefaultIoResolverBase::getBaseBinding
                      (&this->super_TDefaultIoResolverBase,local_40,res,set);
    iVar2 = TDefaultIoResolverBase::getFreeSlot
                      (&this->super_TDefaultIoResolverBase,iVar2,iVar3,local_3c);
    pmVar7 = std::
             map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
             ::operator[](this_00,&resourceKey);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
             ::operator[](pmVar7,local_38);
    *pmVar9 = iVar2;
  }
  else {
    this_01 = &std::
               map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
               ::operator[](this_00,&resourceKey)->_M_t;
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
            ::find(this_01,local_38);
    pmVar7 = std::
             map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
             ::operator[](this_00,&resourceKey);
    if ((_Rb_tree_header *)iVar8._M_node == &(pmVar7->_M_t)._M_impl.super__Rb_tree_header)
    goto LAB_00371216;
    iVar2 = *(int *)&iVar8._M_node[2]._M_parent;
  }
  ent->newBinding = iVar2;
LAB_00371273:
  return ent->newBinding;
}

Assistant:

int TDefaultGlslIoResolver::resolveBinding(EShLanguage stage, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    // On OpenGL arrays of opaque types take a separate binding for each element
    int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
    TResourceType resource = getResourceType(type);
    // don't need to handle uniform symbol, it will be handled in resolveUniformLocation
    if (resource == EResUbo && type.getBasicType() != EbtBlock) {
        return ent.newBinding = -1;
    }
    // There is no 'set' qualifier in OpenGL shading language, each resource has its own
    // binding name space, so remap the 'set' to resource type which make each resource
    // binding is valid from 0 to MAX_XXRESOURCE_BINDINGS
    int set = referenceIntermediate.getSpv().openGl != 0 ? resource : ent.newSet;
    int resourceKey = set;
    if (resource < EResCount) {
        if (type.getQualifier().hasBinding()) {
            int newBinding = reserveSlot(resourceKey, getBaseBinding(stage, resource, set) + type.getQualifier().layoutBinding, numBindings);
            return ent.newBinding = newBinding;

        } else {
            // The resource in current stage is not declared with binding, but it is possible declared
            // with explicit binding in other stages, find the resourceSlotMap firstly to check whether
            // the resource has binding, don't need to allocate if it already has a binding
            bool hasBinding = false;
            ent.newBinding = -1; // leave as -1 if it isn't set below

            if (! resourceSlotMap[resourceKey].empty()) {
                TVarSlotMap::iterator iter = resourceSlotMap[resourceKey].find(name);
                if (iter != resourceSlotMap[resourceKey].end()) {
                    hasBinding = true;
                    ent.newBinding = iter->second;
                }
            }
            if (!hasBinding && (ent.live && doAutoBindingMapping())) {
                // find free slot, the caller did make sure it passes all vars with binding
                // first and now all are passed that do not have a binding and needs one
                int binding = getFreeSlot(resourceKey, getBaseBinding(stage, resource, set), numBindings);
                resourceSlotMap[resourceKey][name] = binding;
                ent.newBinding = binding;
            }
            return ent.newBinding;
        }
    }
    return ent.newBinding = -1;
}